

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O3

void __thiscall ASN1Test_Pack_Test::TestBody(ASN1Test_Pack_Test *this)

{
  _Head_base<0UL,_asn1_string_st_*,_false> _Var1;
  int iVar2;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var4;
  ASN1_STRING *pAVar5;
  pointer *__ptr;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  *this_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  char *pcVar6;
  pointer message;
  char *in_R9;
  pointer *__ptr_1;
  bool bVar7;
  UniquePtr<ASN1_STRING> str;
  ASN1_STRING *raw;
  UniquePtr<BASIC_CONSTRAINTS> val;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  Bytes local_68;
  _Head_base<0UL,_asn1_string_st_*,_false> local_58;
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  _Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false> local_20;
  
  local_20._M_head_impl = (BASIC_CONSTRAINTS_st *)BASIC_CONSTRAINTS_new();
  local_78[0] = local_20._M_head_impl != (BASIC_CONSTRAINTS_st *)0x0;
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_20._M_head_impl == (BASIC_CONSTRAINTS_st *)0x0) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)local_78,(AssertionResult *)0x51be38,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x808,(char *)CONCAT71(local_50._1_7_,local_50[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_50._1_7_,local_50[0]) != &local_40) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_50._1_7_,local_50[0]),local_40._M_allocated_capacity + 1);
    }
    if ((long *)local_68.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_68.span_.data_ + 8))();
    }
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,local_70);
    }
    goto LAB_001d81d0;
  }
  ((BASIC_CONSTRAINTS *)local_20._M_head_impl)->ca = 0;
  local_58._M_head_impl =
       (asn1_string_st *)
       ASN1_item_pack(local_20._M_head_impl,(ASN1_ITEM *)&BASIC_CONSTRAINTS_it,
                      (ASN1_OCTET_STRING **)0x0);
  local_78[0] = local_58._M_head_impl != (asn1_string_st *)0x0;
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58._M_head_impl == (asn1_string_st *)0x0) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)local_78,(AssertionResult *)0x5194ea,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x80f,(char *)CONCAT71(local_50._1_7_,local_50[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_28,(Message *)&local_68);
    this_00 = &local_28;
LAB_001d805f:
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_70;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_50._1_7_,local_50[0]) != &local_40) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_50._1_7_,local_50[0]),local_40._M_allocated_capacity + 1);
    }
    if ((long *)local_68.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_68.span_.data_ + 8))();
    }
    local_48 = local_70;
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_001d81c1:
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_01,local_48);
    }
  }
  else {
    uVar3._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )ASN1_STRING_get0_data(local_58._M_head_impl);
    iVar2 = ASN1_STRING_length((ASN1_STRING *)local_58._M_head_impl);
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(long)iVar2;
    local_68.span_.data_ = "0";
    local_68.span_.size_ = 2;
    local_78 = (undefined1  [8])
               uVar3._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_50,
               "Bytes(ASN1_STRING_get0_data(str.get()), ASN1_STRING_length(str.get()))",
               "Bytes(kExpected)",(Bytes *)local_78,&local_68);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_78);
      if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = (local_48->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x812,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
      if (local_78 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_78 + 8))();
      }
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
    local_28._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    _Var4._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ASN1_item_pack(local_20._M_head_impl,(ASN1_ITEM *)&BASIC_CONSTRAINTS_it,
                        (ASN1_OCTET_STRING **)&local_28);
    _Var1._M_head_impl = local_58._M_head_impl;
    bVar7 = local_58._M_head_impl != (asn1_string_st *)0x0;
    local_58._M_head_impl = (asn1_string_st *)_Var4._M_head_impl;
    if (bVar7) {
      ASN1_STRING_free((ASN1_STRING *)_Var1._M_head_impl);
    }
    local_78[0] = (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_58._M_head_impl !=
                  (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0;
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_58._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      testing::Message::Message((Message *)&local_68);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_50,(internal *)local_78,(AssertionResult *)0x5194ea,"false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x816,(char *)CONCAT71(local_50._1_7_,local_50[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_30,(Message *)&local_68);
LAB_001d805a:
      this_00 = &local_30;
      goto LAB_001d805f;
    }
    local_78 = (undefined1  [8])local_58._M_head_impl;
    testing::internal::CmpHelperEQ<asn1_string_st*,asn1_string_st*>
              ((internal *)local_50,"raw","str.get()",(asn1_string_st **)&local_28,
               (asn1_string_st **)local_78);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_78);
      if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = (local_48->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x817,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
      if (local_78 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_78 + 8))();
      }
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
    uVar3._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )ASN1_STRING_get0_data(local_58._M_head_impl);
    iVar2 = ASN1_STRING_length((ASN1_STRING *)local_58._M_head_impl);
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(long)iVar2;
    local_68.span_.data_ = "0";
    local_68.span_.size_ = 2;
    local_78 = (undefined1  [8])
               uVar3._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_50,
               "Bytes(ASN1_STRING_get0_data(str.get()), ASN1_STRING_length(str.get()))",
               "Bytes(kExpected)",(Bytes *)local_78,&local_68);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_78);
      if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = (local_48->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x81a,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
      if (local_78 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_78 + 8))();
      }
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
    _Var4._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ASN1_STRING_new();
    _Var1._M_head_impl = local_58._M_head_impl;
    bVar7 = local_58._M_head_impl != (asn1_string_st *)0x0;
    local_58._M_head_impl = (asn1_string_st *)_Var4._M_head_impl;
    if (bVar7) {
      ASN1_STRING_free((ASN1_STRING *)_Var1._M_head_impl);
    }
    local_78[0] = local_58._M_head_impl != (asn1_string_st *)0x0;
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_58._M_head_impl == (asn1_string_st *)0x0) {
      testing::Message::Message((Message *)&local_68);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_50,(internal *)local_78,(AssertionResult *)0x5194ea,"false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x81d,(char *)CONCAT71(local_50._1_7_,local_50[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_30,(Message *)&local_68);
      goto LAB_001d805a;
    }
    local_28._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         local_58._M_head_impl;
    pAVar5 = ASN1_item_pack(local_20._M_head_impl,(ASN1_ITEM *)&BASIC_CONSTRAINTS_it,
                            (ASN1_OCTET_STRING **)&local_28);
    local_78[0] = pAVar5 != (ASN1_STRING *)0x0;
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (pAVar5 == (ASN1_STRING *)0x0) {
      testing::Message::Message((Message *)&local_68);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_50,(internal *)local_78,
                 (AssertionResult *)"ASN1_item_pack(val.get(), (&(BASIC_CONSTRAINTS_it)), &raw)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x820,(char *)CONCAT71(local_50._1_7_,local_50[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_30,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_50._1_7_,local_50[0]) != &local_40) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_50._1_7_,local_50[0]),local_40._M_allocated_capacity + 1);
      }
      if ((long *)local_68.span_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_68.span_.data_ + 8))();
      }
      if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_70,local_70);
      }
    }
    local_78 = (undefined1  [8])local_58._M_head_impl;
    testing::internal::CmpHelperEQ<asn1_string_st*,asn1_string_st*>
              ((internal *)local_50,"raw","str.get()",(asn1_string_st **)&local_28,
               (asn1_string_st **)local_78);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_78);
      if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = (local_48->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x821,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
      if (local_78 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_78 + 8))();
      }
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
    _Var4._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ASN1_STRING_get0_data(local_58._M_head_impl);
    iVar2 = ASN1_STRING_length((ASN1_STRING *)local_58._M_head_impl);
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(long)iVar2;
    local_68.span_.data_ = "0";
    local_68.span_.size_ = 2;
    local_78 = (undefined1  [8])_Var4._M_head_impl;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_50,
               "Bytes(ASN1_STRING_get0_data(str.get()), ASN1_STRING_length(str.get()))",
               "Bytes(kExpected)",(Bytes *)local_78,&local_68);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_78);
      if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_48->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x824,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )local_78 !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(long *)local_78 + 8))();
      }
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_48;
      goto LAB_001d81c1;
    }
  }
  std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&local_58);
LAB_001d81d0:
  std::unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter> *)&local_20);
  return;
}

Assistant:

TEST(ASN1Test, Pack) {
  bssl::UniquePtr<BASIC_CONSTRAINTS> val(BASIC_CONSTRAINTS_new());
  ASSERT_TRUE(val);
  val->ca = 0;

  // Test all three calling conventions.
  static const uint8_t kExpected[] = {0x30, 0x00};
  bssl::UniquePtr<ASN1_STRING> str(
      ASN1_item_pack(val.get(), ASN1_ITEM_rptr(BASIC_CONSTRAINTS), nullptr));
  ASSERT_TRUE(str);
  EXPECT_EQ(
      Bytes(ASN1_STRING_get0_data(str.get()), ASN1_STRING_length(str.get())),
      Bytes(kExpected));

  ASN1_STRING *raw = nullptr;
  str.reset(ASN1_item_pack(val.get(), ASN1_ITEM_rptr(BASIC_CONSTRAINTS), &raw));
  ASSERT_TRUE(str);
  EXPECT_EQ(raw, str.get());
  EXPECT_EQ(
      Bytes(ASN1_STRING_get0_data(str.get()), ASN1_STRING_length(str.get())),
      Bytes(kExpected));

  str.reset(ASN1_STRING_new());
  ASSERT_TRUE(str);
  raw = str.get();
  EXPECT_TRUE(
      ASN1_item_pack(val.get(), ASN1_ITEM_rptr(BASIC_CONSTRAINTS), &raw));
  EXPECT_EQ(raw, str.get());
  EXPECT_EQ(
      Bytes(ASN1_STRING_get0_data(str.get()), ASN1_STRING_length(str.get())),
      Bytes(kExpected));
}